

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O3

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  _Bool _Var1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  char *tok_buf;
  char value [256];
  char content [1024];
  byte *local_568;
  ulong local_560;
  ulong local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char local_538 [256];
  char local_438 [1032];
  
  local_540 = digest->nonce;
  local_568 = (byte *)chlg;
  Curl_auth_digest_cleanup(digest);
  local_560 = 0;
  local_558 = 0;
  do {
    bVar6 = *chlg;
    if (bVar6 != 0) {
      ppuVar3 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) break;
        bVar6 = ((byte *)chlg)[1];
        chlg = (char *)((byte *)chlg + 1);
      } while (bVar6 != 0);
    }
    local_568 = (byte *)chlg;
    _Var1 = Curl_auth_digest_get_pair(chlg,local_538,local_438,(char **)&local_568);
    if (!_Var1) {
      if ((local_540 != (char *)0x0) && (digest->stale != true)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce != (char *)0x0) {
        return CURLE_OK;
      }
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar2 = Curl_strcasecompare(local_538,"nonce");
    if (iVar2 != 0) {
      (*Curl_cfree)(digest->nonce);
      pcVar4 = (*Curl_cstrdup)(local_438);
      digest->nonce = pcVar4;
      goto LAB_00523a3b;
    }
    iVar2 = Curl_strcasecompare(local_538,"stale");
    if (iVar2 != 0) {
      iVar2 = Curl_strcasecompare(local_438,"true");
      if (iVar2 != 0) {
        digest->stale = true;
        digest->nc = 1;
      }
      goto LAB_00523a44;
    }
    iVar2 = Curl_strcasecompare(local_538,"realm");
    if (iVar2 == 0) {
      iVar2 = Curl_strcasecompare(local_538,"opaque");
      if (iVar2 != 0) {
        (*Curl_cfree)(digest->opaque);
        pcVar4 = (*Curl_cstrdup)(local_438);
        digest->opaque = pcVar4;
        goto LAB_00523a3b;
      }
      iVar2 = Curl_strcasecompare(local_538,"qop");
      if (iVar2 != 0) {
        local_550 = (char *)0x0;
        local_548 = (*Curl_cstrdup)(local_438);
        if (local_548 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar4 = strtok_r(local_548,",",&local_550);
        uVar7 = local_560;
        while (pcVar4 != (char *)0x0) {
          iVar2 = Curl_strcasecompare(pcVar4,"auth");
          if (iVar2 == 0) {
            iVar2 = Curl_strcasecompare(pcVar4,"auth-int");
            local_558 = CONCAT71((int7)(local_558 >> 8),(byte)local_558 | iVar2 != 0);
          }
          else {
            uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
          }
          pcVar4 = strtok_r((char *)0x0,",",&local_550);
        }
        (*Curl_cfree)(local_548);
        local_560 = uVar7;
        if ((uVar7 & 1) == 0) {
          if ((local_558 & 1) == 0) goto LAB_00523a44;
          (*Curl_cfree)(digest->qop);
          pcVar4 = "auth-int";
        }
        else {
          (*Curl_cfree)(digest->qop);
          pcVar4 = "auth";
        }
        pcVar4 = (*Curl_cstrdup)(pcVar4);
        digest->qop = pcVar4;
        goto LAB_00523a3b;
      }
      iVar2 = Curl_strcasecompare(local_538,"algorithm");
      if (iVar2 != 0) {
        (*Curl_cfree)(digest->algorithm);
        pcVar4 = (*Curl_cstrdup)(local_438);
        digest->algorithm = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar2 = Curl_strcasecompare(local_438,"MD5-sess");
        if (iVar2 == 0) {
          iVar2 = Curl_strcasecompare(local_438,"MD5");
          if (iVar2 == 0) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          digest->algo = 0;
        }
        else {
          digest->algo = 1;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->realm);
      pcVar4 = (*Curl_cstrdup)(local_438);
      digest->realm = pcVar4;
LAB_00523a3b:
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_00523a44:
    chlg = (char *)local_568;
    bVar6 = *local_568;
    if (bVar6 != 0) {
      ppuVar3 = __ctype_b_loc();
      do {
        pbVar5 = (byte *)chlg + 1;
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) {
          local_568 = (byte *)chlg;
          if (bVar6 == 0x2c) {
            chlg = (char *)pbVar5;
            local_568 = pbVar5;
          }
          break;
        }
        bVar6 = *pbVar5;
        chlg = (char *)pbVar5;
        local_568 = pbVar5;
      } while (bVar6 != 0);
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}